

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

void ImVector_ImFontPtr_resize(ImVector_ImFontPtr *self,int new_size)

{
  int new_size_local;
  ImVector_ImFontPtr *self_local;
  
  ImVector<ImFont_*>::resize(self,new_size);
  return;
}

Assistant:

CIMGUI_API void ImVector_ImFontPtr_resize(ImVector_ImFontPtr* self,int new_size)
{
    return self->resize(new_size);
}